

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Sector_ChangeFlags
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  FSectorTagIterator local_40;
  FSectorTagIterator itr;
  bool rtn;
  int secNum;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (arg0 == 0) {
    ln_local._4_4_ = 0;
  }
  else {
    itr.searchtag._3_1_ = 0;
    FSectorTagIterator::FSectorTagIterator(&local_40,arg0);
    while( true ) {
      itr.start = FSectorTagIterator::Next(&local_40);
      if (itr.start < 0) break;
      sectors[itr.start].Flags =
           (sectors[itr.start].Flags | arg1 & 0x3fffffffU) & (arg2 & 0x3fffffffU ^ 0xffffffff);
      itr.searchtag._3_1_ = 1;
    }
    ln_local._4_4_ = (uint)(itr.searchtag._3_1_ & 1);
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_Sector_ChangeFlags)
// Sector_ChangeFlags (tag, set, clear)
{
	int secNum;
	bool rtn;

	if (!arg0)
		return false;

	rtn = false;
	FSectorTagIterator itr(arg0);
	// exclude protected flags
	arg1 &= ~SECF_NOMODIFY;
	arg2 &= ~SECF_NOMODIFY;
	while ((secNum = itr.Next()) >= 0)
	{
		sectors[secNum].Flags = (sectors[secNum].Flags | arg1) & ~arg2;
		rtn = true;
	}
	return rtn;
}